

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O1

bool google::protobuf::internal::GetAnyFieldDescriptors
               (Message *message,FieldDescriptor **type_url_field,FieldDescriptor **value_field)

{
  int iVar1;
  Type TVar2;
  undefined4 extraout_var;
  FieldDescriptor *pFVar3;
  Descriptor *this;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  this = (Descriptor *)CONCAT44(extraout_var,iVar1);
  iVar1 = std::__cxx11::string::compare(*(char **)(this + 8));
  if (iVar1 == 0) {
    pFVar3 = Descriptor::FindFieldByNumber(this,1);
    *type_url_field = pFVar3;
    pFVar3 = Descriptor::FindFieldByNumber(this,2);
    *value_field = pFVar3;
    if (((*type_url_field != (FieldDescriptor *)0x0) &&
        (TVar2 = FieldDescriptor::type(*type_url_field), TVar2 == TYPE_STRING)) &&
       (*value_field != (FieldDescriptor *)0x0)) {
      TVar2 = FieldDescriptor::type(*value_field);
      return TVar2 == TYPE_BYTES;
    }
  }
  return false;
}

Assistant:

bool GetAnyFieldDescriptors(const Message& message,
                            const FieldDescriptor** type_url_field,
                            const FieldDescriptor** value_field) {
    const Descriptor* descriptor = message.GetDescriptor();
    if (descriptor->full_name() != kAnyFullTypeName) {
      return false;
    }
    *type_url_field = descriptor->FindFieldByNumber(1);
    *value_field = descriptor->FindFieldByNumber(2);
    return (*type_url_field != NULL &&
            (*type_url_field)->type() == FieldDescriptor::TYPE_STRING &&
            *value_field != NULL &&
            (*value_field)->type() == FieldDescriptor::TYPE_BYTES);
}